

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

uint FindNextPattern(uchar *buffer,uint size,uint offset,uchar *pattern,uint size_of_pattern)

{
  byte bVar1;
  int iVar2;
  void *__s2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  
  __s2 = operator_new__((ulong)(size_of_pattern * 8));
  lVar4 = 0;
  for (uVar3 = 0; uVar3 != size_of_pattern; uVar3 = uVar3 + 1) {
    bVar1 = pattern[uVar3];
    lVar4 = (long)(int)lVar4;
    for (uVar5 = 7; uVar5 != 0xffffffff; uVar5 = uVar5 - 1) {
      *(bool *)((long)__s2 + lVar4) = (bVar1 >> (uVar5 & 0x1f) & 1) != 0;
      lVar4 = lVar4 + 1;
    }
  }
  uVar3 = (ulong)offset;
  if (offset <= size) {
    offset = size;
  }
  do {
    if (size <= uVar3) {
LAB_00153d0d:
      operator_delete__(__s2);
      uVar5 = 0xffffffff;
      if (offset != size) {
        uVar5 = offset;
      }
      return uVar5;
    }
    iVar2 = bcmp(buffer + uVar3,__s2,(ulong)(size_of_pattern * 8));
    if (iVar2 == 0) {
      offset = (uint)uVar3;
      goto LAB_00153d0d;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

unsigned int FindNextPattern(unsigned char* buffer, unsigned int size, unsigned int offset,
                             const unsigned char* pattern, unsigned int size_of_pattern)
{
   // Convert pattern to bit array
   unsigned char* pattern_in_bits = new unsigned char[size_of_pattern * 8];
   int index = 0;
   for (unsigned int i = 0; i < size_of_pattern; i++)
   {
      for (int j = 0; j < 8; j++)
      {
         unsigned char c = ((pattern[i] >> (7 - j)) & 0x01);
         pattern_in_bits[index++] = c;
      }
   }

   // Find this array

   while (offset < size && memcmp(&buffer[offset], pattern_in_bits, size_of_pattern * 8) != 0)
   {
      ++offset;
   }

   delete[]pattern_in_bits;

   if (offset == size) return -1;
   return offset;
}